

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O0

int ncnn::gemm_x86(Mat *A,Mat *B,Mat *C,Mat *top_blob,int broadcast_type_C,int transA,int transB,
                  int output_transpose,int constant_TILE_M,int constant_TILE_N,int constant_TILE_K,
                  int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000030;
  long in_stack_00000038;
  bool k_end;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  Mat *CT_tile;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  Mat ATX;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int N;
  int K;
  int M;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int in_stack_00003b40;
  int in_stack_00003b48;
  int in_stack_00003b50;
  int in_stack_00003b58;
  int in_stack_00003b60;
  int in_stack_00003b68;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffff454;
  undefined4 in_stack_fffffffffffff458;
  undefined4 in_stack_fffffffffffff45c;
  int in_stack_fffffffffffff464;
  int in_stack_fffffffffffff468;
  int in_stack_fffffffffffff46c;
  Mat *in_stack_fffffffffffff470;
  int in_stack_fffffffffffff4b0;
  int in_stack_fffffffffffff4b4;
  undefined8 in_stack_fffffffffffff4b8;
  Mat *pMVar3;
  undefined8 in_stack_fffffffffffff4c0;
  int in_stack_fffffffffffff4d0;
  int in_stack_fffffffffffff4d4;
  int *in_stack_fffffffffffff4d8;
  Mat *in_stack_fffffffffffff4e0;
  Mat *in_stack_fffffffffffff4e8;
  void **in_stack_fffffffffffff4f0;
  int k_00;
  int *in_stack_fffffffffffff4f8;
  int i_00;
  Mat *in_stack_fffffffffffff500;
  Mat *in_stack_fffffffffffff508;
  void **local_ad0;
  int local_a80;
  int local_a7c;
  int local_a78;
  int local_a74;
  int local_a1c;
  int local_a18;
  int local_a14;
  int local_a10;
  int local_a0c;
  int local_a08;
  int local_a00 [8];
  Allocator *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  Mat local_9b8;
  Mat local_970;
  Mat local_928;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  void **local_8d0;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  void *local_8b8;
  int *local_8b0;
  ulong local_8a8;
  undefined4 local_8a0;
  long *local_898;
  int local_890;
  int local_88c;
  int local_888;
  undefined4 local_884;
  undefined4 local_880;
  ulong local_878;
  void *local_870;
  int *local_868;
  void *local_860;
  undefined4 local_858;
  undefined4 in_stack_fffffffffffff7b0;
  undefined4 in_stack_fffffffffffff7b4;
  undefined8 uVar4;
  long *plVar5;
  int in_stack_fffffffffffff7b8;
  int in_stack_fffffffffffff7bc;
  Mat *in_stack_fffffffffffff7c0;
  Mat *in_stack_fffffffffffff7c8;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  int local_818;
  int local_814;
  void *local_810;
  int *local_808;
  ulong local_800;
  undefined4 local_7f8;
  long *local_7f0;
  int local_7e8;
  int local_7e4;
  int local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  long local_7d0;
  undefined8 local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined4 local_7b0;
  Allocator *local_7a8;
  undefined4 uVar6;
  Mat *in_stack_fffffffffffff870;
  void *local_780;
  int *local_778;
  size_t local_770;
  int local_768;
  Allocator *local_760;
  undefined4 local_758;
  int local_754;
  undefined4 local_750;
  undefined4 local_74c;
  undefined4 local_748;
  long local_740;
  int local_734;
  int local_730;
  int local_72c;
  int local_728;
  int local_724;
  int local_720;
  int local_71c;
  int local_718;
  int local_714;
  int local_710;
  void *local_700;
  int *local_6f8;
  size_t local_6f0;
  int local_6e8;
  Allocator *local_6e0;
  undefined4 local_6d8;
  int local_6d4;
  int local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  long local_6c0;
  void *local_6b8;
  int *local_6b0;
  size_t local_6a8;
  int local_6a0;
  Allocator *local_698;
  undefined4 local_690;
  int local_68c;
  int local_688;
  undefined4 local_684;
  undefined4 local_680;
  long local_678;
  int local_66c;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  int local_650;
  int local_64c;
  int local_648;
  int local_644;
  void **local_638;
  long local_628;
  void **local_620;
  void **local_618;
  undefined8 *local_610;
  void **local_600;
  void **local_5f8;
  Mat *local_5e8;
  int *local_5d8;
  Mat *local_5c8;
  Mat *local_5b8;
  void **local_5a8;
  void **local_598;
  void **local_588;
  void **local_578;
  undefined1 local_565;
  int local_564;
  void **local_560;
  int *local_558;
  undefined1 local_545;
  int local_544;
  void **local_540;
  Mat *local_538;
  undefined1 local_525;
  int local_524;
  void **local_520;
  void **local_518;
  undefined1 local_505;
  int local_504;
  void **local_500;
  undefined8 *local_4f8;
  undefined4 local_4e8;
  int local_4e4;
  int *local_4e0;
  Mat *local_4d8;
  undefined4 local_4d0;
  int local_4cc;
  Mat *local_4c8;
  Mat *local_4c0;
  undefined4 local_4b8;
  int local_4b4;
  undefined8 *local_4b0;
  void **local_4a8;
  int local_450;
  undefined4 local_44c;
  void **local_448;
  int local_430;
  undefined4 local_42c;
  void **local_428;
  int local_410;
  undefined4 local_40c;
  void **local_408;
  int local_3f0;
  undefined4 local_3ec;
  void **local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  Mat *local_3c8;
  int local_3b0;
  undefined4 local_3ac;
  Mat *local_3a8;
  int *local_388;
  Mat *local_368;
  int local_350;
  undefined4 local_34c;
  void **local_348;
  int local_340;
  undefined4 local_33c;
  void **local_338;
  undefined8 *local_318;
  void **local_308;
  void **local_300;
  void **local_2f8;
  int local_2f0;
  undefined4 local_2ec;
  void **local_2e8;
  Allocator *local_2e0;
  int local_2d4;
  size_t local_2d0;
  void *local_2c8;
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  long *local_2a8;
  undefined4 local_29c;
  ulong local_298;
  void *local_290;
  undefined4 local_284;
  int local_280;
  int local_27c;
  void **local_278;
  Allocator *local_270;
  int local_264;
  size_t local_260;
  void *local_258;
  undefined4 local_24c;
  int local_248;
  int local_244;
  Mat *local_240;
  Allocator *local_238;
  int local_22c;
  size_t local_228;
  void *local_220;
  undefined4 local_214;
  int local_210;
  int local_20c;
  int *local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  Allocator *local_1c0;
  int local_1b4;
  size_t local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  void **local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  void *local_178;
  undefined4 local_170;
  int local_16c;
  Mat *local_168;
  Allocator *local_160;
  int local_154;
  size_t local_150;
  void *local_148;
  undefined4 local_140;
  int local_13c;
  Mat *local_138;
  void *local_130;
  void *local_118;
  void *local_110;
  void *local_e0;
  void *local_d0;
  void *local_c0;
  void *local_b0;
  void *local_a0;
  void *local_90;
  undefined8 in_stack_ffffffffffffff88;
  Mat *in_stack_ffffffffffffff90;
  Mat *in_stack_ffffffffffffff98;
  Mat *CT_tile_00;
  Mat *BT_tile_00;
  undefined4 in_stack_ffffffffffffffb0;
  
  uVar4 = CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0);
  if (in_R9D == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a0c = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a0c = *(int *)(in_RDI + 0x30);
    }
    local_a08 = local_a0c * *(int *)(in_RDI + 0x18);
  }
  else {
    local_a08 = *(int *)(in_RDI + 0x2c);
  }
  local_64c = local_a08;
  if (in_R9D == 0) {
    local_a14 = *(int *)(in_RDI + 0x2c);
  }
  else {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_a10 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_a10 = *(int *)(in_RDI + 0x30);
    }
    local_a14 = local_a10 * *(int *)(in_RDI + 0x18);
  }
  local_650 = local_a14;
  if (in_stack_00000008 == 0) {
    local_a1c = *(int *)(in_RSI + 0x2c);
  }
  else {
    if (*(int *)(in_RSI + 0x28) == 3) {
      local_a18 = *(int *)(in_RSI + 0x38);
    }
    else {
      local_a18 = *(int *)(in_RSI + 0x30);
    }
    local_a1c = local_a18 * *(int *)(in_RSI + 0x18);
  }
  local_654 = local_a1c;
  uVar2 = in_stack_00000030;
  local_648 = in_R9D;
  local_644 = in_R8D;
  local_638 = in_RDX;
  local_628 = in_RDI;
  get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffff4c0 >> 0x20),(int)in_stack_fffffffffffff4c0,
             (int)((ulong)in_stack_fffffffffffff4b8 >> 0x20),(int)in_stack_fffffffffffff4b8,
             in_stack_fffffffffffff4b4,in_stack_fffffffffffff4b0,
             (int *)CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
             in_stack_fffffffffffff4d8,(int *)in_stack_fffffffffffff4e0,
             (int)in_stack_fffffffffffff4e8);
  local_664 = (local_64c + -1 + local_658) / local_658;
  local_668 = (local_654 + -1 + local_65c) / local_65c;
  local_66c = (local_650 + -1 + local_660) / local_660;
  CT_tile_00 = *(Mat **)(in_stack_00000038 + 0x10);
  BT_tile_00 = (Mat *)0x4;
  local_6b8 = (void *)0x0;
  local_6b0 = (int *)0x0;
  local_6a8 = 0;
  local_6a0 = 0;
  local_698 = (Allocator *)0x0;
  local_690 = 0;
  local_68c = 0;
  local_688 = 0;
  local_684 = 0;
  local_680 = 0;
  local_678 = 0;
  Mat::create(in_stack_fffffffffffff470,in_stack_fffffffffffff46c,in_stack_fffffffffffff468,
              in_stack_fffffffffffff464,
              CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
              (Allocator *)CONCAT44(in_stack_fffffffffffff454,uVar2));
  local_700 = (void *)0x0;
  local_6f8 = (int *)0x0;
  local_6f0 = 0;
  local_6e8 = 0;
  local_6e0 = (Allocator *)0x0;
  local_6d8 = 0;
  local_6d4 = 0;
  local_6d0 = 0;
  local_6cc = 0;
  local_6c8 = 0;
  local_6c0 = 0;
  Mat::create(in_stack_fffffffffffff470,in_stack_fffffffffffff46c,in_stack_fffffffffffff468,
              in_stack_fffffffffffff464,
              CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
              (Allocator *)CONCAT44(in_stack_fffffffffffff454,uVar2));
  local_710 = local_668 * local_66c;
  for (local_714 = 0; local_714 < local_710; local_714 = local_714 + 1) {
    local_718 = local_714 / local_66c;
    local_71c = local_714 % local_66c;
    local_720 = local_718 * local_65c;
    local_724 = local_71c * local_660;
    local_72c = local_654 - local_720;
    piVar1 = std::min<int>(&local_72c,&local_65c);
    local_728 = *piVar1;
    local_734 = local_650 - local_724;
    piVar1 = std::min<int>(&local_734,&local_660);
    local_730 = *piVar1;
    local_504 = local_720 / local_65c;
    local_4f8 = &local_7c8;
    local_500 = &local_700;
    local_2c8 = (void *)((long)local_700 + local_6c0 * local_504 * local_6f0);
    local_2b0 = &local_7c8;
    local_1c8 = (long)local_6d4 * (long)local_6d0 * local_6f0;
    local_4b4 = local_724 / local_660;
    local_4a8 = &local_780;
    local_4b0 = &local_7c8;
    local_1a8 = (void *)((long)local_2c8 + (long)local_6d4 * (long)local_4b4 * local_6f0);
    local_198 = &local_780;
    local_740 = (long)local_6d4;
    local_610 = &local_7c8;
    local_748 = 1;
    local_74c = 1;
    local_750 = 1;
    local_754 = local_6d4;
    local_758 = 2;
    local_760 = local_6e0;
    local_768 = local_6e8;
    local_770 = local_6f0;
    local_778 = (int *)0x0;
    local_7a8 = local_6e0;
    local_1a0 = 1;
    local_1b0 = local_6f0;
    local_1b4 = local_6e8;
    local_1c0 = local_6e0;
    local_1cc = 0x10;
    local_2b4 = local_6d4;
    local_2b8 = local_6d0;
    local_2bc = local_6cc;
    local_2d0 = local_6f0;
    local_2d4 = local_6e8;
    local_2e0 = local_6e0;
    local_4b8 = 1;
    local_505 = 1;
    local_7c8 = 0;
    local_7b8 = 0;
    local_7b0 = 0;
    uVar6 = 0;
    local_7c0 = 0;
    local_318 = local_610;
    local_780 = local_1a8;
    if (in_stack_00000008 == 0) {
      transpose_pack_B_tile
                (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,in_stack_fffffffffffff7bc,
                 in_stack_fffffffffffff7b8,(int)((ulong)uVar4 >> 0x20),(int)uVar4);
    }
    else {
      pack_B_tile((Mat *)0x0,in_stack_fffffffffffff870,0,0,0,0);
    }
    local_600 = &local_780;
    local_338 = local_600;
    if (local_778 != (int *)0x0) {
      local_33c = 0xffffffff;
      LOCK();
      local_340 = *local_778;
      *local_778 = *local_778 + -1;
      UNLOCK();
      if (local_340 == 1) {
        if (local_760 == (Allocator *)0x0) {
          local_118 = local_780;
          if (local_780 != (void *)0x0) {
            free(local_780);
          }
        }
        else {
          (*local_760->_vptr_Allocator[3])(local_760,local_780);
        }
      }
    }
    local_780 = (void *)0x0;
    local_770 = 0;
    local_768 = 0;
    local_758 = 0;
    local_754 = 0;
    local_750 = 0;
    local_74c = 0;
    local_748 = 0;
    local_740 = 0;
    local_778 = (int *)0x0;
  }
  local_620 = &local_810;
  local_810 = (void *)0x0;
  local_808 = (int *)0x0;
  local_800 = 0;
  local_7f8 = 0;
  local_7f0 = (long *)0x0;
  local_7e8 = 0;
  local_7e4 = 0;
  local_7e0 = 0;
  local_7dc = 0;
  local_7d8 = 0;
  local_7d0 = 0;
  if (((local_660 < local_650) || (local_644 == 3)) || (in_stack_00000010 != 0)) {
    Mat::create(in_stack_fffffffffffff470,in_stack_fffffffffffff46c,in_stack_fffffffffffff468,
                in_stack_fffffffffffff464,
                CONCAT44(in_stack_fffffffffffff45c,in_stack_fffffffffffff458),
                (Allocator *)CONCAT44(in_stack_fffffffffffff454,uVar2));
  }
  for (local_814 = 0; local_814 < local_664; local_814 = local_814 + 1) {
    local_818 = local_814 * local_658;
    if (local_648 == 0) {
      if (*(int *)(local_628 + 0x28) == 3) {
        local_a78 = *(int *)(local_628 + 0x38);
      }
      else {
        local_a78 = *(int *)(local_628 + 0x30);
      }
      local_a74 = local_a78 * *(int *)(local_628 + 0x18);
    }
    else {
      local_a74 = *(int *)(local_628 + 0x2c);
    }
    local_81c = local_a74;
    if (local_648 == 0) {
      local_a80 = *(int *)(local_628 + 0x2c);
    }
    else {
      if (*(int *)(local_628 + 0x28) == 3) {
        local_a7c = *(int *)(local_628 + 0x38);
      }
      else {
        local_a7c = *(int *)(local_628 + 0x30);
      }
      local_a80 = local_a7c * *(int *)(local_628 + 0x18);
    }
    local_820 = local_a80;
    local_828 = local_a74 - local_818;
    piVar1 = std::min<int>(&local_828,&local_658);
    local_824 = *piVar1;
    local_618 = &local_870;
    local_870 = (void *)0x0;
    local_868 = (int *)0x0;
    local_860 = (void *)0x0;
    local_858 = 0;
    plVar5 = (long *)0x0;
    if (((local_660 < local_820) || (local_644 == 3)) || (in_stack_00000010 != 0)) {
      local_524 = get_omp_thread_num();
      local_518 = &local_8b8;
      local_520 = &local_810;
      local_290 = (void *)((long)local_810 + local_7d0 * local_524 * local_800);
      local_278 = &local_8b8;
      local_8b8 = local_290;
      local_8b0 = (int *)0x0;
      local_8a8 = local_800;
      local_8a0 = local_7f8;
      local_898 = local_7f0;
      local_88c = local_7e4;
      local_888 = local_7e0;
      local_884 = 1;
      local_880 = local_7dc;
      local_1d8 = (long)local_7e4 * (long)local_7e0 * local_800;
      local_878 = (local_1d8 + 0xfU & 0xfffffffffffffff0) / local_800;
      local_890 = local_7e8 + -1;
      if (local_7e8 == 4) {
        local_878 = (long)local_7e4 * (long)local_7e0;
      }
      local_1dc = 0x10;
      local_27c = local_7e4;
      local_280 = local_7e0;
      local_284 = local_7dc;
      local_298 = local_800;
      local_29c = local_7f8;
      local_2a8 = local_7f0;
      local_525 = 1;
      local_308 = &local_8b8;
      local_300 = &local_870;
      if (&local_870 != local_308) {
        local_2e8 = &local_870;
        if (local_868 != (int *)0x0) {
          local_2ec = 0xffffffff;
          LOCK();
          local_2f0 = *local_868;
          *local_868 = *local_868 + -1;
          UNLOCK();
          if (local_2f0 == 1) {
            if (plVar5 == (long *)0x0) {
              local_130 = local_870;
              if (local_870 != (void *)0x0) {
                free(local_870);
              }
            }
            else {
              (**(code **)(*plVar5 + 0x18))(plVar5,local_870);
            }
          }
        }
        local_870 = (void *)0x0;
        local_860 = (void *)0x0;
        local_858 = 0;
        local_868 = (int *)0x0;
        local_870 = *local_308;
        local_868 = (int *)local_308[1];
        local_860 = local_308[2];
        local_858 = *(undefined4 *)(local_308 + 3);
        plVar5 = (long *)local_308[4];
      }
      local_5f8 = &local_8b8;
      local_348 = local_5f8;
      local_2f8 = &local_870;
      if (local_8b0 != (int *)0x0) {
        local_34c = 0xffffffff;
        LOCK();
        local_350 = *local_8b0;
        *local_8b0 = *local_8b0 + -1;
        UNLOCK();
        if (local_350 == 1) {
          if (local_898 == (long *)0x0) {
            local_110 = local_8b8;
            if (local_8b8 != (void *)0x0) {
              free(local_8b8);
            }
          }
          else {
            (**(code **)(*local_898 + 0x18))(local_898,local_8b8);
          }
        }
      }
      local_8b8 = (void *)0x0;
      local_8a8 = 0;
      local_8a0 = 0;
      local_890 = 0;
      local_88c = 0;
      local_888 = 0;
      local_884 = 0;
      local_880 = 0;
      local_878 = 0;
      local_8b0 = (int *)0x0;
    }
    for (local_8bc = 0; local_8bc < local_654; local_8bc = local_65c + local_8bc) {
      local_8c4 = local_654 - local_8bc;
      piVar1 = std::min<int>(&local_8c4,&local_65c);
      local_8c0 = *piVar1;
      if (local_644 == 3) {
        pack_A_tile(in_stack_fffffffffffff508,in_stack_fffffffffffff500,
                    (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20),(int)in_stack_fffffffffffff4f8,
                    (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),(int)in_stack_fffffffffffff4f0);
      }
      if (local_644 == 3) {
        local_ad0 = &local_870;
      }
      else {
        local_ad0 = local_638;
      }
      local_8d0 = local_ad0;
      for (local_8d4 = 0; local_8d4 < local_820; local_8d4 = local_660 + local_8d4) {
        local_8dc = local_820 - local_8d4;
        piVar1 = std::min<int>(&local_8dc,&local_660);
        local_8d8 = *piVar1;
        local_544 = get_omp_thread_num();
        local_538 = &local_970;
        local_540 = &local_6b8;
        local_258 = (void *)((long)local_6b8 + local_678 * local_544 * local_6a8);
        local_240 = &local_970;
        local_1e8 = (long)local_68c * (long)local_688 * local_6a8;
        local_4cc = local_8d4 / local_660;
        local_4c0 = &local_928;
        local_4c8 = &local_970;
        local_178 = (void *)((long)local_258 + (long)local_68c * (long)local_4cc * local_6a8);
        in_stack_fffffffffffff508 = &local_928;
        local_928.cstep = (size_t)local_68c;
        in_stack_fffffffffffff500 = &local_970;
        local_564 = local_8bc / local_65c;
        local_558 = local_a00;
        in_stack_fffffffffffff4f0 = &local_700;
        local_220 = (void *)((long)local_700 + local_6c0 * local_564 * local_6f0);
        in_stack_fffffffffffff4f8 = local_a00;
        local_1f8 = (long)local_6d4 * (long)local_6d0 * local_6f0;
        local_4e4 = local_8d4 / local_660;
        local_4d8 = &local_9b8;
        local_4e0 = local_a00;
        local_148 = (void *)((long)local_220 + (long)local_6d4 * (long)local_4e4 * local_6f0);
        in_stack_fffffffffffff4e0 = &local_9b8;
        local_9b8.cstep = (size_t)local_6d4;
        in_stack_fffffffffffff4d8 = local_a00;
        local_928.c = 1;
        local_928.d = 1;
        local_928.h = 1;
        local_928.w = local_68c;
        local_928.dims = 2;
        local_928.allocator = local_698;
        local_928.elempack = local_6a0;
        local_928.elemsize = local_6a8;
        local_928.refcount = (int *)0x0;
        local_970.c = 0;
        local_970.d = 0;
        local_970.h = 0;
        local_970.w = 0;
        local_970.allocator = local_698;
        local_970.elempack = 0;
        local_970.elemsize = 0;
        local_970.refcount = (int *)0x0;
        local_970.data = (void *)0x0;
        local_9b8.c = 1;
        local_9b8.d = 1;
        local_9b8.h = 1;
        local_9b8.w = local_6d4;
        local_9b8.dims = 2;
        local_9b8.allocator = local_6e0;
        local_9b8.elempack = local_6e8;
        local_9b8.elemsize = local_6f0;
        local_9b8.refcount = (int *)0x0;
        local_9e0 = local_6e0;
        local_13c = local_6d4;
        local_140 = 1;
        local_150 = local_6f0;
        local_154 = local_6e8;
        local_160 = local_6e0;
        local_16c = local_68c;
        local_170 = 1;
        local_180 = local_6a8;
        local_184 = local_6a0;
        local_190 = local_698;
        local_1ec = 0x10;
        local_1fc = 0x10;
        local_20c = local_6d4;
        local_210 = local_6d0;
        local_214 = local_6cc;
        local_228 = local_6f0;
        local_22c = local_6e8;
        local_238 = local_6e0;
        local_244 = local_68c;
        local_248 = local_688;
        local_24c = local_684;
        local_260 = local_6a8;
        local_264 = local_6a0;
        local_270 = local_698;
        local_4d0 = 1;
        local_4e8 = 1;
        local_545 = 1;
        local_565 = 1;
        local_970.cstep = 0;
        local_970.dims = 0;
        local_a00[0] = 0;
        local_a00[1] = 0;
        local_a00[4] = 0;
        local_a00[5] = 0;
        local_a00[6] = 0;
        local_9d8 = 0;
        local_9d4 = 0;
        local_9d0 = 0;
        local_9cc = 0;
        local_9c8 = 0;
        local_9c0 = 0;
        local_a00[2] = 0;
        local_a00[3] = 0;
        local_5e8 = in_stack_fffffffffffff500;
        local_5d8 = in_stack_fffffffffffff4d8;
        local_560 = in_stack_fffffffffffff4f0;
        local_388 = in_stack_fffffffffffff4d8;
        local_368 = in_stack_fffffffffffff500;
        local_208 = in_stack_fffffffffffff4f8;
        local_168 = in_stack_fffffffffffff508;
        local_138 = in_stack_fffffffffffff4e0;
        local_9b8.data = local_148;
        local_928.data = local_178;
        if (local_8bc == 0) {
          k_00 = (int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
          i_00 = (int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
          if (local_648 == 0) {
            pack_A_tile(in_stack_fffffffffffff508,in_stack_fffffffffffff500,i_00,
                        (int)in_stack_fffffffffffff4f8,k_00,(int)in_stack_fffffffffffff4f0);
          }
          else {
            transpose_pack_A_tile
                      (in_stack_fffffffffffff508,in_stack_fffffffffffff500,i_00,
                       (int)in_stack_fffffffffffff4f8,k_00,(int)in_stack_fffffffffffff4f0);
          }
        }
        gemm_transB_packed_tile
                  ((Mat *)CONCAT44(in_stack_00000030,in_stack_ffffffffffffffb0),BT_tile_00,
                   CT_tile_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                   (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_00003b40,
                   in_stack_00003b48,in_stack_00003b50,in_stack_00003b58,in_stack_00003b60,
                   in_stack_00003b68,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0));
        pMVar3 = &local_9b8;
        local_5c8 = pMVar3;
        local_3a8 = pMVar3;
        if (local_9b8.refcount != (int *)0x0) {
          local_3ac = 0xffffffff;
          LOCK();
          local_3b0 = *local_9b8.refcount;
          *local_9b8.refcount = *local_9b8.refcount + -1;
          UNLOCK();
          if (local_3b0 == 1) {
            if (local_9b8.allocator == (Allocator *)0x0) {
              local_e0 = local_9b8.data;
              if (local_9b8.data != (void *)0x0) {
                free(local_9b8.data);
              }
            }
            else {
              (*(local_9b8.allocator)->_vptr_Allocator[3])(local_9b8.allocator,local_9b8.data);
            }
          }
        }
        pMVar3->data = (void *)0x0;
        pMVar3->elemsize = 0;
        pMVar3->elempack = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->cstep = 0;
        pMVar3->refcount = (int *)0x0;
        pMVar3 = &local_928;
        local_5b8 = pMVar3;
        local_3c8 = pMVar3;
        if (local_928.refcount != (int *)0x0) {
          local_3cc = 0xffffffff;
          LOCK();
          local_3d0 = *local_928.refcount;
          *local_928.refcount = *local_928.refcount + -1;
          UNLOCK();
          if (local_3d0 == 1) {
            if (local_928.allocator == (Allocator *)0x0) {
              local_d0 = local_928.data;
              if (local_928.data != (void *)0x0) {
                free(local_928.data);
              }
            }
            else {
              (*(local_928.allocator)->_vptr_Allocator[3])(local_928.allocator,local_928.data);
            }
          }
        }
        pMVar3->data = (void *)0x0;
        pMVar3->elemsize = 0;
        pMVar3->elempack = 0;
        pMVar3->dims = 0;
        pMVar3->w = 0;
        pMVar3->h = 0;
        pMVar3->d = 0;
        pMVar3->c = 0;
        pMVar3->cstep = 0;
        pMVar3->refcount = (int *)0x0;
      }
      if (in_stack_00000010 != 0) {
        transpose_unpack_output_tile
                  (in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,
                   (int)((ulong)in_stack_fffffffffffff4d8 >> 0x20),(int)in_stack_fffffffffffff4d8,
                   in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0);
      }
    }
    local_5a8 = &local_870;
    local_3e8 = local_5a8;
    if (local_868 != (int *)0x0) {
      local_3ec = 0xffffffff;
      LOCK();
      local_3f0 = *local_868;
      *local_868 = *local_868 + -1;
      UNLOCK();
      if (local_3f0 == 1) {
        if (plVar5 == (long *)0x0) {
          local_c0 = local_870;
          if (local_870 != (void *)0x0) {
            free(local_870);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x18))(plVar5,local_870);
        }
      }
    }
    local_870 = (void *)0x0;
    local_860 = (void *)0x0;
    local_858 = 0;
    local_868 = (int *)0x0;
  }
  local_598 = &local_810;
  local_408 = local_598;
  if (local_808 != (int *)0x0) {
    local_40c = 0xffffffff;
    LOCK();
    local_410 = *local_808;
    *local_808 = *local_808 + -1;
    UNLOCK();
    if (local_410 == 1) {
      if (local_7f0 == (long *)0x0) {
        local_b0 = local_810;
        if (local_810 != (void *)0x0) {
          free(local_810);
        }
      }
      else {
        (**(code **)(*local_7f0 + 0x18))(local_7f0,local_810);
      }
    }
  }
  local_810 = (void *)0x0;
  local_800 = 0;
  local_7f8 = 0;
  local_7e8 = 0;
  local_7e4 = 0;
  local_7e0 = 0;
  local_7dc = 0;
  local_7d8 = 0;
  local_7d0 = 0;
  local_808 = (int *)0x0;
  local_588 = &local_700;
  local_428 = local_588;
  if (local_6f8 != (int *)0x0) {
    local_42c = 0xffffffff;
    LOCK();
    local_430 = *local_6f8;
    *local_6f8 = *local_6f8 + -1;
    UNLOCK();
    if (local_430 == 1) {
      if (local_6e0 == (Allocator *)0x0) {
        local_a0 = local_700;
        if (local_700 != (void *)0x0) {
          free(local_700);
        }
      }
      else {
        (*local_6e0->_vptr_Allocator[3])(local_6e0,local_700);
      }
    }
  }
  local_700 = (void *)0x0;
  local_6f0 = 0;
  local_6e8 = 0;
  local_6d8 = 0;
  local_6d4 = 0;
  local_6d0 = 0;
  local_6cc = 0;
  local_6c8 = 0;
  local_6c0 = 0;
  local_6f8 = (int *)0x0;
  local_578 = &local_6b8;
  if (local_6b0 != (int *)0x0) {
    local_44c = 0xffffffff;
    LOCK();
    local_450 = *local_6b0;
    *local_6b0 = *local_6b0 + -1;
    UNLOCK();
    if (local_450 == 1) {
      local_448 = local_578;
      if (local_698 == (Allocator *)0x0) {
        local_90 = local_6b8;
        if (local_6b8 != (void *)0x0) {
          free(local_6b8);
        }
      }
      else {
        (*local_698->_vptr_Allocator[3])(local_698,local_6b8);
      }
    }
  }
  return 0;
}

Assistant:

static int gemm_x86(const Mat& A, const Mat& B, const Mat& C, Mat& top_blob, int broadcast_type_C, int transA, int transB, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
    const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;
    const int N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    int nn_N = (N + TILE_N - 1) / TILE_N;
    int nn_K = (K + TILE_K - 1) / TILE_K;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);

    const int nn_NK = nn_N * nn_K;

    // pack B
    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        if (transB)
        {
            pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
        else
        {
            transpose_pack_B_tile(B, BT_tile, j, max_jj, k, max_kk);
        }
    }

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}